

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O1

word * makeArrayB(word **a,int nFuncs)

{
  word *pwVar1;
  ulong uVar2;
  
  pwVar1 = (word *)malloc((long)nFuncs * 8);
  if (0 < nFuncs) {
    uVar2 = 0;
    do {
      pwVar1[uVar2] = *a[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)nFuncs != uVar2);
  }
  return pwVar1;
}

Assistant:

word* makeArrayB(word** a, int nFuncs)
{
    int i;
    word* b;
    b = (word*)malloc(sizeof(word)*(nFuncs));
    for(i=0;i<nFuncs;i++)
        b[i] = a[i][0];

    return b;
}